

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathDebugDumpObject(FILE *output,xmlXPathObjectPtr cur,int depth)

{
  double dVar1;
  xmlNodeSetPtr pxVar2;
  int *piVar3;
  _xmlNode *p_Var4;
  int iVar5;
  ulong uVar6;
  xmlNodePtr cur_00;
  _xmlNode *node;
  char *pcVar7;
  long lVar8;
  size_t sStack_180;
  char local_178 [112];
  char shift [100];
  char local_98 [104];
  
  if (output == (FILE *)0x0) {
    return;
  }
  lVar8 = (long)depth;
  for (uVar6 = 0; ((long)uVar6 < lVar8 && (uVar6 < 0x19)); uVar6 = uVar6 + 1) {
    (shift + uVar6 * 2)[0] = ' ';
    (shift + uVar6 * 2)[1] = ' ';
  }
  (shift + uVar6 * 2)[0] = '\0';
  (shift + uVar6 * 2)[1] = '\0';
  fputs(shift,(FILE *)output);
  if (cur == (xmlXPathObjectPtr)0x0) {
    pcVar7 = "Object is empty (NULL)\n";
    goto LAB_001d1f8a;
  }
  switch(cur->type) {
  case XPATH_UNDEFINED:
    pcVar7 = "Object is uninitialized\n";
    sStack_180 = 0x18;
    goto LAB_001d1f8c;
  case XPATH_NODESET:
    fwrite("Object is a Node Set :\n",0x17,1,(FILE *)output);
    pxVar2 = cur->nodesetval;
    for (uVar6 = 0; ((long)uVar6 < lVar8 && (uVar6 < 0x19)); uVar6 = uVar6 + 1) {
      (local_178 + uVar6 * 2)[0] = ' ';
      (local_178 + uVar6 * 2)[1] = ' ';
    }
    (local_178 + uVar6 * 2)[0] = '\0';
    (local_178 + uVar6 * 2)[1] = '\0';
    if (pxVar2 != (xmlNodeSetPtr)0x0) {
      fprintf((FILE *)output,"Set contains %d nodes:\n",(ulong)(uint)pxVar2->nodeNr);
      uVar6 = 0;
      while ((long)uVar6 < (long)pxVar2->nodeNr) {
        fputs(local_178,(FILE *)output);
        fprintf((FILE *)output,"%d",uVar6 + 1 & 0xffffffff);
        xmlXPathDebugDumpNode(output,pxVar2->nodeTab[uVar6],depth + 1);
        uVar6 = uVar6 + 1;
      }
      return;
    }
    fputs(local_178,(FILE *)output);
    pcVar7 = "NodeSet is NULL !\n";
    sStack_180 = 0x12;
    break;
  case XPATH_BOOLEAN:
    fwrite("Object is a Boolean : ",0x16,1,(FILE *)output);
    if (cur->boolval == 0) {
      pcVar7 = "false\n";
      sStack_180 = 6;
    }
    else {
      pcVar7 = "true\n";
      sStack_180 = 5;
    }
    goto LAB_001d1f8c;
  case XPATH_NUMBER:
    dVar1 = cur->floatval;
    iVar5 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
    if (ABS(dVar1) != INFINITY) {
      iVar5 = 0;
    }
    if (iVar5 == -1) {
      pcVar7 = "Object is a number : -Infinity\n";
      sStack_180 = 0x1f;
      goto LAB_001d1f8c;
    }
    if (iVar5 == 1) {
      pcVar7 = "Object is a number : Infinity\n";
      sStack_180 = 0x1e;
      goto LAB_001d1f8c;
    }
    if (NAN(dVar1)) {
      pcVar7 = "Object is a number : NaN\n";
      sStack_180 = 0x19;
      goto LAB_001d1f8c;
    }
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      fprintf((FILE *)output,"Object is a number : %0g\n");
      return;
    }
    pcVar7 = "Object is a number : 0\n";
    goto LAB_001d1f8a;
  case XPATH_STRING:
    fwrite("Object is a string : ",0x15,1,(FILE *)output);
    xmlDebugDumpString(output,cur->stringval);
    goto LAB_001d23f8;
  case XPATH_POINT:
    fprintf((FILE *)output,"Object is a point : index %d in node",(ulong)(uint)cur->index);
    cur_00 = (xmlNodePtr)cur->user;
    goto LAB_001d23ee;
  case XPATH_RANGE:
    if ((cur->user2 == (void *)0x0) || ((cur->user2 == cur->user && (cur->index == cur->index2)))) {
      fwrite("Object is a collapsed range :\n",0x1e,1,(FILE *)output);
      fputs(shift,(FILE *)output);
      if (-1 < cur->index) {
        fprintf((FILE *)output,"index %d in ");
      }
      fwrite("node\n",5,1,(FILE *)output);
      xmlXPathDebugDumpNode(output,(xmlNodePtr)cur->user,depth + 1);
      return;
    }
    fwrite("Object is a range :\n",0x14,1,(FILE *)output);
    fputs(shift,(FILE *)output);
    fwrite("From ",5,1,(FILE *)output);
    if (-1 < cur->index) {
      fprintf((FILE *)output,"index %d in ");
    }
    fwrite("node\n",5,1,(FILE *)output);
    xmlXPathDebugDumpNode(output,(xmlNodePtr)cur->user,depth + 1);
    fputs(shift,(FILE *)output);
    fwrite("To ",3,1,(FILE *)output);
    if (-1 < cur->index2) {
      fprintf((FILE *)output,"index %d in ");
    }
    fwrite("node\n",5,1,(FILE *)output);
    cur_00 = (xmlNodePtr)cur->user2;
LAB_001d23ee:
    xmlXPathDebugDumpNode(output,cur_00,depth + 1);
LAB_001d23f8:
    fputc(10,(FILE *)output);
    return;
  case XPATH_LOCATIONSET:
    fwrite("Object is a Location Set:\n",0x1a,1,(FILE *)output);
    piVar3 = (int *)cur->user;
    for (uVar6 = 0; ((long)uVar6 < lVar8 && (uVar6 < 0x19)); uVar6 = uVar6 + 1) {
      (local_178 + uVar6 * 2)[0] = ' ';
      (local_178 + uVar6 * 2)[1] = ' ';
    }
    (local_178 + uVar6 * 2)[0] = '\0';
    (local_178 + uVar6 * 2)[1] = '\0';
    if (piVar3 != (int *)0x0) {
      uVar6 = 0;
      while ((long)uVar6 < (long)*piVar3) {
        fputs(local_178,(FILE *)output);
        fprintf((FILE *)output,"%d : ",uVar6 + 1 & 0xffffffff);
        xmlXPathDebugDumpObject
                  (output,*(xmlXPathObjectPtr *)(*(long *)(piVar3 + 2) + uVar6 * 8),depth + 1);
        uVar6 = uVar6 + 1;
      }
      return;
    }
    fputs(local_178,(FILE *)output);
    pcVar7 = "LocationSet is NULL !\n";
    sStack_180 = 0x16;
    break;
  case XPATH_USERS:
    pcVar7 = "Object is user defined\n";
LAB_001d1f8a:
    sStack_180 = 0x17;
LAB_001d1f8c:
    fwrite(pcVar7,sStack_180,1,(FILE *)output);
    return;
  case XPATH_XSLT_TREE:
    fwrite("Object is an XSLT value tree :\n",0x1f,1,(FILE *)output);
    pxVar2 = cur->nodesetval;
    for (uVar6 = 0; ((long)uVar6 < lVar8 && (uVar6 < 0x19)); uVar6 = uVar6 + 1) {
      (local_98 + uVar6 * 2)[0] = ' ';
      (local_98 + uVar6 * 2)[1] = ' ';
    }
    (local_98 + uVar6 * 2)[0] = '\0';
    (local_98 + uVar6 * 2)[1] = '\0';
    if (((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) ||
       (*pxVar2->nodeTab == (xmlNodePtr)0x0)) {
      fputs(local_98,(FILE *)output);
      pcVar7 = "Value Tree is NULL !\n";
      sStack_180 = 0x15;
    }
    else {
      fputs(local_98,(FILE *)output);
      fprintf((FILE *)output,"%d",(ulong)((int)uVar6 + 1));
      node = (*pxVar2->nodeTab)->children;
      for (uVar6 = 0; ((long)uVar6 < (long)(depth + 1) && (uVar6 < 0x19)); uVar6 = uVar6 + 1) {
        (local_178 + uVar6 * 2)[0] = ' ';
        (local_178 + uVar6 * 2)[1] = ' ';
      }
      (local_178 + uVar6 * 2)[0] = '\0';
      (local_178 + uVar6 * 2)[1] = '\0';
      if (node != (_xmlNode *)0x0) {
        while (node != (xmlNodePtr)0x0) {
          p_Var4 = node->next;
          xmlDebugDumpOneNode(output,node,depth + 1);
          node = p_Var4;
        }
        return;
      }
      fputs(local_178,(FILE *)output);
      pcVar7 = "Node is NULL !\n";
      sStack_180 = 0xf;
    }
    break;
  default:
    goto switchD_001d1f76_default;
  }
  fwrite(pcVar7,sStack_180,1,(FILE *)output);
switchD_001d1f76_default:
  return;
}

Assistant:

void
xmlXPathDebugDumpObject(FILE *output, xmlXPathObjectPtr cur, int depth) {
    int i;
    char shift[100];

    if (output == NULL) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;


    fprintf(output, "%s", shift);

    if (cur == NULL) {
        fprintf(output, "Object is empty (NULL)\n");
	return;
    }
    switch(cur->type) {
        case XPATH_UNDEFINED:
	    fprintf(output, "Object is uninitialized\n");
	    break;
        case XPATH_NODESET:
	    fprintf(output, "Object is a Node Set :\n");
	    xmlXPathDebugDumpNodeSet(output, cur->nodesetval, depth);
	    break;
	case XPATH_XSLT_TREE:
	    fprintf(output, "Object is an XSLT value tree :\n");
	    xmlXPathDebugDumpValueTree(output, cur->nodesetval, depth);
	    break;
        case XPATH_BOOLEAN:
	    fprintf(output, "Object is a Boolean : ");
	    if (cur->boolval) fprintf(output, "true\n");
	    else fprintf(output, "false\n");
	    break;
        case XPATH_NUMBER:
	    switch (xmlXPathIsInf(cur->floatval)) {
	    case 1:
		fprintf(output, "Object is a number : Infinity\n");
		break;
	    case -1:
		fprintf(output, "Object is a number : -Infinity\n");
		break;
	    default:
		if (xmlXPathIsNaN(cur->floatval)) {
		    fprintf(output, "Object is a number : NaN\n");
		} else if (cur->floatval == 0) {
                    /* Omit sign for negative zero. */
		    fprintf(output, "Object is a number : 0\n");
		} else {
		    fprintf(output, "Object is a number : %0g\n", cur->floatval);
		}
	    }
	    break;
        case XPATH_STRING:
	    fprintf(output, "Object is a string : ");
	    xmlDebugDumpString(output, cur->stringval);
	    fprintf(output, "\n");
	    break;
	case XPATH_POINT:
	    fprintf(output, "Object is a point : index %d in node", cur->index);
	    xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user, depth + 1);
	    fprintf(output, "\n");
	    break;
	case XPATH_RANGE:
	    if ((cur->user2 == NULL) ||
		((cur->user2 == cur->user) && (cur->index == cur->index2))) {
		fprintf(output, "Object is a collapsed range :\n");
		fprintf(output, "%s", shift);
		if (cur->index >= 0)
		    fprintf(output, "index %d in ", cur->index);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user,
			              depth + 1);
	    } else  {
		fprintf(output, "Object is a range :\n");
		fprintf(output, "%s", shift);
		fprintf(output, "From ");
		if (cur->index >= 0)
		    fprintf(output, "index %d in ", cur->index);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user,
			              depth + 1);
		fprintf(output, "%s", shift);
		fprintf(output, "To ");
		if (cur->index2 >= 0)
		    fprintf(output, "index %d in ", cur->index2);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user2,
			              depth + 1);
		fprintf(output, "\n");
	    }
	    break;
	case XPATH_LOCATIONSET:
#if defined(LIBXML_XPTR_ENABLED)
	    fprintf(output, "Object is a Location Set:\n");
	    xmlXPathDebugDumpLocationSet(output,
		    (xmlLocationSetPtr) cur->user, depth);
#endif
	    break;
	case XPATH_USERS:
	    fprintf(output, "Object is user defined\n");
	    break;
    }
}